

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_coroutine_release(green_coroutine_t coro)

{
  int *piVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  if (coro == (green_coroutine_t)0x0) {
    pcVar2 = "coro != ((void*)0)";
    uVar3 = 0x139;
  }
  else {
    if (coro->loop != (green_loop_t)0x0) {
      piVar1 = &coro->refs;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        if (coro->stack == (void *)0x0) {
          pcVar2 = "coro->stack != ((void*)0)";
          uVar3 = 0x13d;
          goto LAB_00102ab3;
        }
        free(coro->stack);
        coro->stack = (void *)0x0;
        piVar1 = &coro->loop->coroutines;
        *piVar1 = *piVar1 + -1;
        free(coro);
      }
      return 0;
    }
    pcVar2 = "coro->loop != ((void*)0)";
    uVar3 = 0x13a;
  }
LAB_00102ab3:
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,uVar3);
  fflush(_stderr);
  abort();
}

Assistant:

int green_coroutine_release(green_coroutine_t coro)
{
    green_assert(coro != NULL);
    green_assert(coro->loop != NULL);
    if (--coro->refs == 0) {
#if GREEN_USE_UCONTEXT
        green_assert(coro->stack != NULL);
        green_free(coro->stack);
        coro->stack = NULL;
#endif
        --coro->loop->coroutines;
        green_free(coro);
    }
    return GREEN_SUCCESS;
}